

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_intra_pred_filters_ssse3_intr.c
# Opt level: O3

void ihevc_intra_pred_luma_mode_18_34_ssse3
               (UWORD8 *pu1_ref,WORD32 src_strd,UWORD8 *pu1_dst,WORD32 dst_strd,WORD32 nt,
               WORD32 mode)

{
  undefined1 auVar1 [16];
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  uint uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  bool bVar21;
  long lVar22;
  int iVar23;
  bool bVar24;
  ulong uVar25;
  UWORD8 *pUVar26;
  
  uVar12 = nt * 2;
  if (mode == 0x22) {
    if (nt == 4) {
      uVar2 = *(undefined4 *)(pu1_ref + (ulong)uVar12 + 3);
      uVar3 = *(undefined4 *)(pu1_ref + (ulong)uVar12 + 4);
      uVar4 = *(undefined4 *)(pu1_ref + (ulong)uVar12 + 5);
      *(undefined4 *)pu1_dst = *(undefined4 *)(pu1_ref + (ulong)uVar12 + 2);
      lVar22 = (long)dst_strd;
      *(undefined4 *)(pu1_dst + lVar22) = uVar2;
      *(undefined4 *)(pu1_dst + lVar22 * 2) = uVar3;
      *(undefined4 *)(pu1_dst + lVar22 * 3) = uVar4;
    }
    else if (nt == 8) {
      uVar5 = *(undefined8 *)(pu1_ref + (ulong)uVar12 + 3);
      uVar6 = *(undefined8 *)(pu1_ref + (ulong)uVar12 + 4);
      uVar7 = *(undefined8 *)(pu1_ref + (ulong)uVar12 + 5);
      uVar8 = *(undefined8 *)(pu1_ref + (ulong)uVar12 + 6);
      uVar9 = *(undefined8 *)(pu1_ref + (ulong)uVar12 + 7);
      uVar10 = *(undefined8 *)(pu1_ref + (ulong)uVar12 + 8);
      uVar11 = *(undefined8 *)(pu1_ref + (ulong)uVar12 + 9);
      *(undefined8 *)pu1_dst = *(undefined8 *)(pu1_ref + (ulong)uVar12 + 2);
      lVar22 = (long)dst_strd;
      *(undefined8 *)(pu1_dst + lVar22) = uVar5;
      *(undefined8 *)(pu1_dst + lVar22 * 2) = uVar6;
      *(undefined8 *)(pu1_dst + lVar22 * 3) = uVar7;
      *(undefined8 *)(pu1_dst + lVar22 * 4) = uVar8;
      *(undefined8 *)(pu1_dst + lVar22 * 5) = uVar9;
      *(undefined8 *)(pu1_dst + lVar22 * 6) = uVar10;
      *(undefined8 *)(pu1_dst + lVar22 * 7) = uVar11;
    }
    else if (nt == 0x10) {
      lVar22 = (long)dst_strd;
      uVar25 = 0;
      bVar21 = true;
      do {
        bVar24 = bVar21;
        uVar5 = *(undefined8 *)(pu1_ref + uVar25 + (ulong)uVar12 + 2 + 8);
        uVar6 = *(undefined8 *)(pu1_ref + uVar25 + (ulong)uVar12 + 3);
        uVar7 = *(undefined8 *)(pu1_ref + uVar25 + (ulong)uVar12 + 3 + 8);
        uVar8 = *(undefined8 *)(pu1_ref + uVar25 + (ulong)uVar12 + 4);
        uVar9 = *(undefined8 *)(pu1_ref + uVar25 + (ulong)uVar12 + 4 + 8);
        uVar10 = *(undefined8 *)(pu1_ref + uVar25 + (ulong)uVar12 + 5);
        uVar11 = *(undefined8 *)(pu1_ref + uVar25 + (ulong)uVar12 + 5 + 8);
        uVar13 = *(undefined8 *)(pu1_ref + uVar25 + (ulong)uVar12 + 6);
        uVar14 = *(undefined8 *)(pu1_ref + uVar25 + (ulong)uVar12 + 6 + 8);
        uVar15 = *(undefined8 *)(pu1_ref + uVar25 + (ulong)uVar12 + 7);
        uVar16 = *(undefined8 *)(pu1_ref + uVar25 + (ulong)uVar12 + 7 + 8);
        uVar17 = *(undefined8 *)(pu1_ref + uVar25 + (ulong)uVar12 + 8);
        uVar18 = *(undefined8 *)(pu1_ref + uVar25 + (ulong)uVar12 + 8 + 8);
        uVar19 = *(undefined8 *)(pu1_ref + uVar25 + (ulong)uVar12 + 9);
        uVar20 = *(undefined8 *)(pu1_ref + uVar25 + (ulong)uVar12 + 9 + 8);
        *(undefined8 *)(pu1_dst + uVar25 * lVar22) =
             *(undefined8 *)(pu1_ref + uVar25 + (ulong)uVar12 + 2);
        *(undefined8 *)(pu1_dst + uVar25 * lVar22 + 8) = uVar5;
        *(undefined8 *)(pu1_dst + (uVar25 | 1) * lVar22) = uVar6;
        *(undefined8 *)(pu1_dst + (uVar25 | 1) * lVar22 + 8) = uVar7;
        *(undefined8 *)(pu1_dst + (uVar25 | 2) * lVar22) = uVar8;
        *(undefined8 *)(pu1_dst + (uVar25 | 2) * lVar22 + 8) = uVar9;
        *(undefined8 *)(pu1_dst + (uVar25 | 3) * lVar22) = uVar10;
        *(undefined8 *)(pu1_dst + (uVar25 | 3) * lVar22 + 8) = uVar11;
        *(undefined8 *)(pu1_dst + (uVar25 | 4) * lVar22) = uVar13;
        *(undefined8 *)(pu1_dst + (uVar25 | 4) * lVar22 + 8) = uVar14;
        *(undefined8 *)(pu1_dst + (uVar25 | 5) * lVar22) = uVar15;
        *(undefined8 *)(pu1_dst + (uVar25 | 5) * lVar22 + 8) = uVar16;
        *(undefined8 *)(pu1_dst + (uVar25 | 6) * lVar22) = uVar17;
        *(undefined8 *)(pu1_dst + (uVar25 | 6) * lVar22 + 8) = uVar18;
        *(undefined8 *)(pu1_dst + (uVar25 | 7) * lVar22) = uVar19;
        *(undefined8 *)(pu1_dst + (uVar25 | 7) * lVar22 + 8) = uVar20;
        uVar25 = 8;
        bVar21 = false;
      } while (bVar24);
    }
    else if (0 < nt) {
      lVar22 = 0;
      do {
        uVar5 = *(undefined8 *)(pu1_ref + lVar22 + (ulong)uVar12 + 0x12);
        uVar6 = *(undefined8 *)(pu1_ref + lVar22 + (ulong)uVar12 + 0x12 + 8);
        uVar7 = *(undefined8 *)(pu1_ref + lVar22 + (ulong)uVar12 + 0x13);
        uVar8 = *(undefined8 *)(pu1_ref + lVar22 + (ulong)uVar12 + 0x13 + 8);
        uVar9 = *(undefined8 *)(pu1_ref + lVar22 + (ulong)uVar12 + 0x14);
        uVar10 = *(undefined8 *)(pu1_ref + lVar22 + (ulong)uVar12 + 0x14 + 8);
        uVar11 = *(undefined8 *)(pu1_ref + lVar22 + (ulong)uVar12 + 2 + 8);
        uVar13 = *(undefined8 *)(pu1_ref + lVar22 + (ulong)uVar12 + 3);
        uVar14 = *(undefined8 *)(pu1_ref + lVar22 + (ulong)uVar12 + 3 + 8);
        uVar15 = *(undefined8 *)(pu1_ref + lVar22 + (ulong)uVar12 + 4);
        uVar16 = *(undefined8 *)(pu1_ref + lVar22 + (ulong)uVar12 + 4 + 8);
        uVar17 = *(undefined8 *)(pu1_ref + lVar22 + (ulong)uVar12 + 5);
        uVar18 = *(undefined8 *)(pu1_ref + lVar22 + (ulong)uVar12 + 5 + 8);
        uVar19 = *(undefined8 *)(pu1_ref + lVar22 + (ulong)uVar12 + 0x15);
        uVar20 = *(undefined8 *)(pu1_ref + lVar22 + (ulong)uVar12 + 0x15 + 8);
        *(undefined8 *)pu1_dst = *(undefined8 *)(pu1_ref + lVar22 + (ulong)uVar12 + 2);
        *(undefined8 *)(pu1_dst + 8) = uVar11;
        *(undefined8 *)(pu1_dst + 0x10) = uVar5;
        *(undefined8 *)(pu1_dst + 0x18) = uVar6;
        *(undefined8 *)(pu1_dst + dst_strd) = uVar13;
        *(undefined8 *)(pu1_dst + dst_strd + 8) = uVar14;
        *(undefined8 *)(pu1_dst + (long)dst_strd + 0x10) = uVar7;
        *(undefined8 *)(pu1_dst + (long)dst_strd + 0x10 + 8) = uVar8;
        *(undefined8 *)(pu1_dst + dst_strd * 2) = uVar15;
        *(undefined8 *)(pu1_dst + dst_strd * 2 + 8) = uVar16;
        *(undefined8 *)(pu1_dst + (long)(dst_strd * 2) + 0x10) = uVar9;
        *(undefined8 *)(pu1_dst + (long)(dst_strd * 2) + 0x10 + 8) = uVar10;
        *(undefined8 *)(pu1_dst + dst_strd * 3) = uVar17;
        *(undefined8 *)(pu1_dst + dst_strd * 3 + 8) = uVar18;
        *(undefined8 *)(pu1_dst + (long)(dst_strd * 3) + 0x10) = uVar19;
        *(undefined8 *)(pu1_dst + (long)(dst_strd * 3) + 0x10 + 8) = uVar20;
        uVar5 = *(undefined8 *)(pu1_ref + lVar22 + (ulong)uVar12 + 0x16);
        uVar6 = *(undefined8 *)(pu1_ref + lVar22 + (ulong)uVar12 + 0x16 + 8);
        uVar7 = *(undefined8 *)(pu1_ref + lVar22 + (ulong)uVar12 + 0x17);
        uVar8 = *(undefined8 *)(pu1_ref + lVar22 + (ulong)uVar12 + 0x17 + 8);
        uVar9 = *(undefined8 *)(pu1_ref + lVar22 + (ulong)uVar12 + 0x18);
        uVar10 = *(undefined8 *)(pu1_ref + lVar22 + (ulong)uVar12 + 0x18 + 8);
        uVar11 = *(undefined8 *)(pu1_ref + lVar22 + (ulong)uVar12 + 6 + 8);
        uVar13 = *(undefined8 *)(pu1_ref + lVar22 + (ulong)uVar12 + 7);
        uVar14 = *(undefined8 *)(pu1_ref + lVar22 + (ulong)uVar12 + 7 + 8);
        uVar15 = *(undefined8 *)(pu1_ref + lVar22 + (ulong)uVar12 + 8);
        uVar16 = *(undefined8 *)(pu1_ref + lVar22 + (ulong)uVar12 + 8 + 8);
        uVar17 = *(undefined8 *)(pu1_ref + lVar22 + (ulong)uVar12 + 9);
        uVar18 = *(undefined8 *)(pu1_ref + lVar22 + (ulong)uVar12 + 9 + 8);
        uVar19 = *(undefined8 *)(pu1_ref + lVar22 + (ulong)uVar12 + 0x19);
        uVar20 = *(undefined8 *)(pu1_ref + lVar22 + (ulong)uVar12 + 0x19 + 8);
        *(undefined8 *)(pu1_dst + dst_strd * 4) =
             *(undefined8 *)(pu1_ref + lVar22 + (ulong)uVar12 + 6);
        *(undefined8 *)(pu1_dst + dst_strd * 4 + 8) = uVar11;
        *(undefined8 *)(pu1_dst + (long)(dst_strd * 4) + 0x10) = uVar5;
        *(undefined8 *)(pu1_dst + (long)(dst_strd * 4) + 0x10 + 8) = uVar6;
        *(undefined8 *)(pu1_dst + dst_strd * 5) = uVar13;
        *(undefined8 *)(pu1_dst + dst_strd * 5 + 8) = uVar14;
        *(undefined8 *)(pu1_dst + (long)(dst_strd * 5) + 0x10) = uVar7;
        *(undefined8 *)(pu1_dst + (long)(dst_strd * 5) + 0x10 + 8) = uVar8;
        *(undefined8 *)(pu1_dst + dst_strd * 6) = uVar15;
        *(undefined8 *)(pu1_dst + dst_strd * 6 + 8) = uVar16;
        *(undefined8 *)(pu1_dst + (long)(dst_strd * 6) + 0x10) = uVar9;
        *(undefined8 *)(pu1_dst + (long)(dst_strd * 6) + 0x10 + 8) = uVar10;
        *(undefined8 *)(pu1_dst + dst_strd * 7) = uVar17;
        *(undefined8 *)(pu1_dst + dst_strd * 7 + 8) = uVar18;
        *(undefined8 *)(pu1_dst + (long)(dst_strd * 7) + 0x10) = uVar19;
        *(undefined8 *)(pu1_dst + (long)(dst_strd * 7) + 0x10 + 8) = uVar20;
        pu1_dst = pu1_dst + dst_strd * 8;
        lVar22 = lVar22 + 8;
      } while ((int)lVar22 < nt);
    }
  }
  else if (nt == 4) {
    auVar1 = *(undefined1 (*) [16])(pu1_ref + ((ulong)uVar12 - 3));
    *(int *)pu1_dst = auVar1._3_4_;
    lVar22 = (long)dst_strd;
    *(int *)(pu1_dst + lVar22) = auVar1._2_4_;
    *(int *)(pu1_dst + lVar22 * 2) = auVar1._1_4_;
    *(int *)(pu1_dst + lVar22 * 3) = auVar1._0_4_;
  }
  else if (nt == 8) {
    auVar1 = *(undefined1 (*) [16])(pu1_ref + ((ulong)uVar12 - 7));
    *(long *)pu1_dst = auVar1._7_8_;
    lVar22 = (long)dst_strd;
    *(long *)(pu1_dst + lVar22) = auVar1._6_8_;
    *(long *)(pu1_dst + lVar22 * 2) = auVar1._5_8_;
    *(long *)(pu1_dst + lVar22 * 3) = auVar1._4_8_;
    *(long *)(pu1_dst + lVar22 * 4) = auVar1._3_8_;
    *(long *)(pu1_dst + lVar22 * 5) = auVar1._2_8_;
    *(long *)(pu1_dst + lVar22 * 6) = auVar1._1_8_;
    *(long *)(pu1_dst + lVar22 * 7) = auVar1._0_8_;
  }
  else if (nt == 0x10) {
    lVar22 = (long)dst_strd;
    uVar25 = 0;
    bVar21 = true;
    do {
      bVar24 = bVar21;
      uVar5 = *(undefined8 *)(pu1_ref + (uVar12 - uVar25) + 8);
      uVar6 = *(undefined8 *)(pu1_ref + ((ulong)uVar12 - (uVar25 | 1)));
      uVar7 = *(undefined8 *)(pu1_ref + ((ulong)uVar12 - (uVar25 | 1)) + 8);
      uVar8 = *(undefined8 *)(pu1_ref + ((ulong)uVar12 - (uVar25 | 2)));
      uVar9 = *(undefined8 *)(pu1_ref + ((ulong)uVar12 - (uVar25 | 2)) + 8);
      uVar10 = *(undefined8 *)(pu1_ref + ((ulong)uVar12 - (uVar25 | 3)));
      uVar11 = *(undefined8 *)(pu1_ref + ((ulong)uVar12 - (uVar25 | 3)) + 8);
      uVar13 = *(undefined8 *)(pu1_ref + ((ulong)uVar12 - (uVar25 | 4)));
      uVar14 = *(undefined8 *)(pu1_ref + ((ulong)uVar12 - (uVar25 | 4)) + 8);
      uVar15 = *(undefined8 *)(pu1_ref + ((ulong)uVar12 - (uVar25 | 5)));
      uVar16 = *(undefined8 *)(pu1_ref + ((ulong)uVar12 - (uVar25 | 5)) + 8);
      uVar17 = *(undefined8 *)(pu1_ref + ((ulong)uVar12 - (uVar25 | 6)));
      uVar18 = *(undefined8 *)(pu1_ref + ((ulong)uVar12 - (uVar25 | 6)) + 8);
      uVar19 = *(undefined8 *)(pu1_ref + ((ulong)uVar12 - (uVar25 | 7)));
      uVar20 = *(undefined8 *)(pu1_ref + ((ulong)uVar12 - (uVar25 | 7)) + 8);
      *(undefined8 *)(pu1_dst + uVar25 * lVar22) = *(undefined8 *)(pu1_ref + (uVar12 - uVar25));
      *(undefined8 *)(pu1_dst + uVar25 * lVar22 + 8) = uVar5;
      *(undefined8 *)(pu1_dst + (uVar25 | 1) * lVar22) = uVar6;
      *(undefined8 *)(pu1_dst + (uVar25 | 1) * lVar22 + 8) = uVar7;
      *(undefined8 *)(pu1_dst + (uVar25 | 2) * lVar22) = uVar8;
      *(undefined8 *)(pu1_dst + (uVar25 | 2) * lVar22 + 8) = uVar9;
      *(undefined8 *)(pu1_dst + (uVar25 | 3) * lVar22) = uVar10;
      *(undefined8 *)(pu1_dst + (uVar25 | 3) * lVar22 + 8) = uVar11;
      *(undefined8 *)(pu1_dst + (uVar25 | 4) * lVar22) = uVar13;
      *(undefined8 *)(pu1_dst + (uVar25 | 4) * lVar22 + 8) = uVar14;
      *(undefined8 *)(pu1_dst + (uVar25 | 5) * lVar22) = uVar15;
      *(undefined8 *)(pu1_dst + (uVar25 | 5) * lVar22 + 8) = uVar16;
      *(undefined8 *)(pu1_dst + (uVar25 | 6) * lVar22) = uVar17;
      *(undefined8 *)(pu1_dst + (uVar25 | 6) * lVar22 + 8) = uVar18;
      *(undefined8 *)(pu1_dst + (uVar25 | 7) * lVar22) = uVar19;
      *(undefined8 *)(pu1_dst + (uVar25 | 7) * lVar22 + 8) = uVar20;
      uVar25 = 8;
      bVar21 = false;
    } while (bVar24);
  }
  else if (0 < nt) {
    pUVar26 = pu1_ref + uVar12;
    iVar23 = 0;
    do {
      uVar5 = *(undefined8 *)(pUVar26 + -3);
      uVar6 = *(undefined8 *)(pUVar26 + 5);
      uVar7 = *(undefined8 *)(pUVar26 + -2);
      uVar8 = *(undefined8 *)(pUVar26 + 6);
      uVar9 = *(undefined8 *)(pUVar26 + -1);
      uVar10 = *(undefined8 *)(pUVar26 + 7);
      uVar11 = *(undefined8 *)(pUVar26 + 8);
      uVar13 = *(undefined8 *)(pUVar26 + 0x10);
      uVar14 = *(undefined8 *)(pUVar26 + 0x18);
      uVar15 = *(undefined8 *)(pUVar26 + 0xf);
      uVar16 = *(undefined8 *)(pUVar26 + 0x17);
      uVar17 = *(undefined8 *)(pUVar26 + 0xe);
      uVar18 = *(undefined8 *)(pUVar26 + 0x16);
      uVar19 = *(undefined8 *)(pUVar26 + 0xd);
      uVar20 = *(undefined8 *)(pUVar26 + 0x15);
      *(undefined8 *)pu1_dst = *(undefined8 *)pUVar26;
      *(undefined8 *)(pu1_dst + 8) = uVar11;
      *(undefined8 *)(pu1_dst + 0x10) = uVar13;
      *(undefined8 *)(pu1_dst + 0x18) = uVar14;
      *(undefined8 *)(pu1_dst + dst_strd) = uVar9;
      *(undefined8 *)(pu1_dst + dst_strd + 8) = uVar10;
      *(undefined8 *)(pu1_dst + (long)dst_strd + 0x10) = uVar15;
      *(undefined8 *)(pu1_dst + (long)dst_strd + 0x10 + 8) = uVar16;
      *(undefined8 *)(pu1_dst + dst_strd * 2) = uVar7;
      *(undefined8 *)(pu1_dst + dst_strd * 2 + 8) = uVar8;
      *(undefined8 *)(pu1_dst + (long)(dst_strd * 2) + 0x10) = uVar17;
      *(undefined8 *)(pu1_dst + (long)(dst_strd * 2) + 0x10 + 8) = uVar18;
      *(undefined8 *)(pu1_dst + dst_strd * 3) = uVar5;
      *(undefined8 *)(pu1_dst + dst_strd * 3 + 8) = uVar6;
      *(undefined8 *)(pu1_dst + (long)(dst_strd * 3) + 0x10) = uVar19;
      *(undefined8 *)(pu1_dst + (long)(dst_strd * 3) + 0x10 + 8) = uVar20;
      uVar5 = *(undefined8 *)(pUVar26 + -7);
      uVar6 = *(undefined8 *)(pUVar26 + 1);
      uVar7 = *(undefined8 *)(pUVar26 + -6);
      uVar8 = *(undefined8 *)(pUVar26 + 2);
      uVar9 = *(undefined8 *)(pUVar26 + -5);
      uVar10 = *(undefined8 *)(pUVar26 + 3);
      uVar11 = *(undefined8 *)(pUVar26 + 4);
      uVar13 = *(undefined8 *)(pUVar26 + 0xc);
      uVar14 = *(undefined8 *)(pUVar26 + 0x14);
      uVar15 = *(undefined8 *)(pUVar26 + 0xb);
      uVar16 = *(undefined8 *)(pUVar26 + 0x13);
      uVar17 = *(undefined8 *)(pUVar26 + 10);
      uVar18 = *(undefined8 *)(pUVar26 + 0x12);
      uVar19 = *(undefined8 *)(pUVar26 + 9);
      uVar20 = *(undefined8 *)(pUVar26 + 0x11);
      *(undefined8 *)(pu1_dst + dst_strd * 4) = *(undefined8 *)(pUVar26 + -4);
      *(undefined8 *)(pu1_dst + dst_strd * 4 + 8) = uVar11;
      *(undefined8 *)(pu1_dst + (long)(dst_strd * 4) + 0x10) = uVar13;
      *(undefined8 *)(pu1_dst + (long)(dst_strd * 4) + 0x10 + 8) = uVar14;
      *(undefined8 *)(pu1_dst + dst_strd * 5) = uVar9;
      *(undefined8 *)(pu1_dst + dst_strd * 5 + 8) = uVar10;
      *(undefined8 *)(pu1_dst + (long)(dst_strd * 5) + 0x10) = uVar15;
      *(undefined8 *)(pu1_dst + (long)(dst_strd * 5) + 0x10 + 8) = uVar16;
      *(undefined8 *)(pu1_dst + dst_strd * 6) = uVar7;
      *(undefined8 *)(pu1_dst + dst_strd * 6 + 8) = uVar8;
      *(undefined8 *)(pu1_dst + (long)(dst_strd * 6) + 0x10) = uVar17;
      *(undefined8 *)(pu1_dst + (long)(dst_strd * 6) + 0x10 + 8) = uVar18;
      *(undefined8 *)(pu1_dst + dst_strd * 7) = uVar5;
      *(undefined8 *)(pu1_dst + dst_strd * 7 + 8) = uVar6;
      *(undefined8 *)(pu1_dst + (long)(dst_strd * 7) + 0x10) = uVar19;
      *(undefined8 *)(pu1_dst + (long)(dst_strd * 7) + 0x10 + 8) = uVar20;
      pu1_dst = pu1_dst + dst_strd * 8;
      iVar23 = iVar23 + 8;
      pUVar26 = pUVar26 + -8;
    } while (iVar23 < nt);
  }
  return;
}

Assistant:

void ihevc_intra_pred_luma_mode_18_34_ssse3(UWORD8 *pu1_ref,
                                            WORD32 src_strd,
                                            UWORD8 *pu1_dst,
                                            WORD32 dst_strd,
                                            WORD32 nt,
                                            WORD32 mode)
{
    WORD32 row;
    WORD32 two_nt = 2 * nt;
    __m128i src_temp1, src_temp2, src_temp3, src_temp4, src_temp5, src_temp6, src_temp7, src_temp8;
    UNUSED(src_strd);
    if(mode == 34)
    {
        if(nt == 4)
        {

            int temp1, temp2, temp3, temp4;

            /*pu1_ref[two_nt + col + idx + 1]*/
            src_temp1 = _mm_loadu_si128((__m128i *)(pu1_ref + two_nt + 2));
            src_temp2 = _mm_loadu_si128((__m128i *)(pu1_ref + two_nt + 3));
            src_temp3 = _mm_loadu_si128((__m128i *)(pu1_ref + two_nt + 4));
            src_temp4 = _mm_loadu_si128((__m128i *)(pu1_ref + two_nt + 5));

            temp1 = _mm_cvtsi128_si32(src_temp1);
            temp2 = _mm_cvtsi128_si32(src_temp2);
            temp3 = _mm_cvtsi128_si32(src_temp3);
            temp4 = _mm_cvtsi128_si32(src_temp4);

            /*pu1_dst[(row * dst_strd) + col] = pu1_ref[two_nt - 1 - row];*/
            *(WORD32 *)(&pu1_dst[(0 * dst_strd)]) = temp1;
            *(WORD32 *)(&pu1_dst[(1 * dst_strd)]) = temp2;
            *(WORD32 *)(&pu1_dst[(2 * dst_strd)]) = temp3;
            *(WORD32 *)(&pu1_dst[(3 * dst_strd)]) = temp4;

        }
        else if(nt == 8)
        {
            /*pu1_ref[two_nt + col + idx + 1]*/
            src_temp1 = _mm_loadu_si128((__m128i *)(pu1_ref + two_nt + 2));
            src_temp2 = _mm_loadu_si128((__m128i *)(pu1_ref + two_nt + 3));
            src_temp3 = _mm_loadu_si128((__m128i *)(pu1_ref + two_nt + 4));
            src_temp4 = _mm_loadu_si128((__m128i *)(pu1_ref + two_nt + 5));
            src_temp5 = _mm_loadu_si128((__m128i *)(pu1_ref + two_nt + 6));
            src_temp6 = _mm_loadu_si128((__m128i *)(pu1_ref + two_nt + 7));
            src_temp7 = _mm_loadu_si128((__m128i *)(pu1_ref + two_nt + 8));
            src_temp8 = _mm_loadu_si128((__m128i *)(pu1_ref + two_nt + 9));

            _mm_storel_epi64((__m128i *)(pu1_dst + (0 * dst_strd)), src_temp1);
            _mm_storel_epi64((__m128i *)(pu1_dst + (1 * dst_strd)), src_temp2);
            _mm_storel_epi64((__m128i *)(pu1_dst + (2 * dst_strd)), src_temp3);
            _mm_storel_epi64((__m128i *)(pu1_dst + (3 * dst_strd)), src_temp4);
            _mm_storel_epi64((__m128i *)(pu1_dst + (4 * dst_strd)), src_temp5);
            _mm_storel_epi64((__m128i *)(pu1_dst + (5 * dst_strd)), src_temp6);
            _mm_storel_epi64((__m128i *)(pu1_dst + (6 * dst_strd)), src_temp7);
            _mm_storel_epi64((__m128i *)(pu1_dst + (7 * dst_strd)), src_temp8);

        }
        else if(nt == 16)
        {
            for(row = 0; row < nt; row += 8)
            {
                /*pu1_ref[two_nt + col + idx + 1]*/
                src_temp1 = _mm_loadu_si128((__m128i *)(pu1_ref + two_nt + (row + 0) + 2));
                src_temp2 = _mm_loadu_si128((__m128i *)(pu1_ref + two_nt + (row + 1) + 2));
                src_temp3 = _mm_loadu_si128((__m128i *)(pu1_ref + two_nt + (row + 2) + 2));
                src_temp4 = _mm_loadu_si128((__m128i *)(pu1_ref + two_nt + (row + 3) + 2));
                src_temp5 = _mm_loadu_si128((__m128i *)(pu1_ref + two_nt + (row + 4) + 2));
                src_temp6 = _mm_loadu_si128((__m128i *)(pu1_ref + two_nt + (row + 5) + 2));
                src_temp7 = _mm_loadu_si128((__m128i *)(pu1_ref + two_nt + (row + 6) + 2));
                src_temp8 = _mm_loadu_si128((__m128i *)(pu1_ref + two_nt + (row + 7) + 2));

                _mm_storeu_si128((__m128i *)(pu1_dst + ((row + 0) * dst_strd)), src_temp1);
                _mm_storeu_si128((__m128i *)(pu1_dst + ((row + 1) * dst_strd)), src_temp2);
                _mm_storeu_si128((__m128i *)(pu1_dst + ((row + 2) * dst_strd)), src_temp3);
                _mm_storeu_si128((__m128i *)(pu1_dst + ((row + 3) * dst_strd)), src_temp4);
                _mm_storeu_si128((__m128i *)(pu1_dst + ((row + 4) * dst_strd)), src_temp5);
                _mm_storeu_si128((__m128i *)(pu1_dst + ((row + 5) * dst_strd)), src_temp6);
                _mm_storeu_si128((__m128i *)(pu1_dst + ((row + 6) * dst_strd)), src_temp7);
                _mm_storeu_si128((__m128i *)(pu1_dst + ((row + 7) * dst_strd)), src_temp8);


            }
        }
        else
        {
            __m128i src_temp9, src_temp10, src_temp11, src_temp12, src_temp13, src_temp14, src_temp15, src_temp16;
            for(row = 0; row < nt; row += 8)
            {
                /*pu1_ref[two_nt + col + idx + 1]*/
                src_temp1  = _mm_loadu_si128((__m128i *)(pu1_ref + two_nt + (0 + 0) + 2));
                src_temp9  = _mm_loadu_si128((__m128i *)(pu1_ref + two_nt + (0 + 16) + 2));
                src_temp2  = _mm_loadu_si128((__m128i *)(pu1_ref + two_nt + (1 + 0) + 2));
                src_temp10 = _mm_loadu_si128((__m128i *)(pu1_ref + two_nt + (1 + 16) + 2));
                src_temp3  = _mm_loadu_si128((__m128i *)(pu1_ref + two_nt + (2 + 0) + 2));
                src_temp11 = _mm_loadu_si128((__m128i *)(pu1_ref + two_nt + (2 + 16) + 2));
                src_temp4  = _mm_loadu_si128((__m128i *)(pu1_ref + two_nt + (3 + 0) + 2));
                src_temp12 = _mm_loadu_si128((__m128i *)(pu1_ref + two_nt + (3 + 16) + 2));

                _mm_storeu_si128((__m128i *)(pu1_dst +  0 + (0 * dst_strd)), src_temp1);
                _mm_storeu_si128((__m128i *)(pu1_dst + 16 + (0 * dst_strd)), src_temp9);
                _mm_storeu_si128((__m128i *)(pu1_dst +  0 + (1 * dst_strd)), src_temp2);
                _mm_storeu_si128((__m128i *)(pu1_dst + 16 + (1 * dst_strd)), src_temp10);
                _mm_storeu_si128((__m128i *)(pu1_dst +  0 + (2 * dst_strd)), src_temp3);
                _mm_storeu_si128((__m128i *)(pu1_dst + 16 + (2 * dst_strd)), src_temp11);
                _mm_storeu_si128((__m128i *)(pu1_dst +  0 + (3 * dst_strd)), src_temp4);
                _mm_storeu_si128((__m128i *)(pu1_dst + 16 + (3 * dst_strd)), src_temp12);

                src_temp5  = _mm_loadu_si128((__m128i *)(pu1_ref + two_nt + (4 + 0) + 2));
                src_temp13 = _mm_loadu_si128((__m128i *)(pu1_ref + two_nt + (4 + 16) + 2));
                src_temp6  = _mm_loadu_si128((__m128i *)(pu1_ref + two_nt + (5 + 0) + 2));
                src_temp14 = _mm_loadu_si128((__m128i *)(pu1_ref + two_nt + (5 + 16) + 2));
                src_temp7  = _mm_loadu_si128((__m128i *)(pu1_ref + two_nt + (6 + 0) + 2));
                src_temp15 = _mm_loadu_si128((__m128i *)(pu1_ref + two_nt + (6 + 16) + 2));
                src_temp8  = _mm_loadu_si128((__m128i *)(pu1_ref + two_nt + (7 + 0) + 2));
                src_temp16 = _mm_loadu_si128((__m128i *)(pu1_ref + two_nt + (7 + 16) + 2));

                _mm_storeu_si128((__m128i *)(pu1_dst +  0 + (4 * dst_strd)), src_temp5);
                _mm_storeu_si128((__m128i *)(pu1_dst + 16 + (4 * dst_strd)), src_temp13);
                _mm_storeu_si128((__m128i *)(pu1_dst +  0 + (5 * dst_strd)), src_temp6);
                _mm_storeu_si128((__m128i *)(pu1_dst + 16 + (5 * dst_strd)), src_temp14);
                _mm_storeu_si128((__m128i *)(pu1_dst +  0 + (6 * dst_strd)), src_temp7);
                _mm_storeu_si128((__m128i *)(pu1_dst + 16 + (6 * dst_strd)), src_temp15);
                _mm_storeu_si128((__m128i *)(pu1_dst +  0 + (7 * dst_strd)), src_temp8);
                _mm_storeu_si128((__m128i *)(pu1_dst + 16 + (7 * dst_strd)), src_temp16);

                pu1_ref += 8;
                pu1_dst += 8 * dst_strd;
            }
        }
    }
    else
    {
        if(nt == 4)
        {
            int temp1, temp2, temp3, temp4;

            /*pu1_ref[two_nt + col + idx + 1]*/
            src_temp1 = _mm_loadu_si128((__m128i *)(pu1_ref + two_nt - 3));
            src_temp2 = _mm_srli_si128(src_temp1, 1);
            src_temp3 = _mm_srli_si128(src_temp1, 2);
            src_temp4 = _mm_srli_si128(src_temp1, 3);

            temp1 = _mm_cvtsi128_si32(src_temp4);
            temp2 = _mm_cvtsi128_si32(src_temp3);
            temp3 = _mm_cvtsi128_si32(src_temp2);
            temp4 = _mm_cvtsi128_si32(src_temp1);

            /*pu1_dst[(row * dst_strd) + col] = pu1_ref[two_nt - 1 - row];*/
            *(WORD32 *)(&pu1_dst[(0 * dst_strd)]) = temp1;
            *(WORD32 *)(&pu1_dst[(1 * dst_strd)]) = temp2;
            *(WORD32 *)(&pu1_dst[(2 * dst_strd)]) = temp3;
            *(WORD32 *)(&pu1_dst[(3 * dst_strd)]) = temp4;

        }
        else if(nt == 8)
        {
            /*pu1_ref[two_nt + col + idx + 1]*/
            src_temp1 = _mm_loadu_si128((__m128i *)(pu1_ref + two_nt - 7));
            src_temp2 = _mm_srli_si128(src_temp1, 1);
            src_temp3 = _mm_srli_si128(src_temp1, 2);
            src_temp4 = _mm_srli_si128(src_temp1, 3);
            src_temp5 = _mm_srli_si128(src_temp1, 4);
            src_temp6 = _mm_srli_si128(src_temp1, 5);
            src_temp7 = _mm_srli_si128(src_temp1, 6);
            src_temp8 = _mm_srli_si128(src_temp1, 7);

            _mm_storel_epi64((__m128i *)(pu1_dst + (0 * dst_strd)), src_temp8);
            _mm_storel_epi64((__m128i *)(pu1_dst + (1 * dst_strd)), src_temp7);
            _mm_storel_epi64((__m128i *)(pu1_dst + (2 * dst_strd)), src_temp6);
            _mm_storel_epi64((__m128i *)(pu1_dst + (3 * dst_strd)), src_temp5);
            _mm_storel_epi64((__m128i *)(pu1_dst + (4 * dst_strd)), src_temp4);
            _mm_storel_epi64((__m128i *)(pu1_dst + (5 * dst_strd)), src_temp3);
            _mm_storel_epi64((__m128i *)(pu1_dst + (6 * dst_strd)), src_temp2);
            _mm_storel_epi64((__m128i *)(pu1_dst + (7 * dst_strd)), src_temp1);


        }
        else if(nt == 16)
        {
            for(row = 0; row < nt; row += 8)
            {
                /*pu1_ref[two_nt + col + idx + 1]*/
                src_temp1 = _mm_loadu_si128((__m128i *)(pu1_ref + two_nt - (row + 0)));
                src_temp2 = _mm_loadu_si128((__m128i *)(pu1_ref + two_nt - (row + 1)));
                src_temp3 = _mm_loadu_si128((__m128i *)(pu1_ref + two_nt - (row + 2)));
                src_temp4 = _mm_loadu_si128((__m128i *)(pu1_ref + two_nt - (row + 3)));
                src_temp5 = _mm_loadu_si128((__m128i *)(pu1_ref + two_nt - (row + 4)));
                src_temp6 = _mm_loadu_si128((__m128i *)(pu1_ref + two_nt - (row + 5)));
                src_temp7 = _mm_loadu_si128((__m128i *)(pu1_ref + two_nt - (row + 6)));
                src_temp8 = _mm_loadu_si128((__m128i *)(pu1_ref + two_nt - (row + 7)));

                _mm_storeu_si128((__m128i *)(pu1_dst + ((row + 0) * dst_strd)), src_temp1);
                _mm_storeu_si128((__m128i *)(pu1_dst + ((row + 1) * dst_strd)), src_temp2);
                _mm_storeu_si128((__m128i *)(pu1_dst + ((row + 2) * dst_strd)), src_temp3);
                _mm_storeu_si128((__m128i *)(pu1_dst + ((row + 3) * dst_strd)), src_temp4);
                _mm_storeu_si128((__m128i *)(pu1_dst + ((row + 4) * dst_strd)), src_temp5);
                _mm_storeu_si128((__m128i *)(pu1_dst + ((row + 5) * dst_strd)), src_temp6);
                _mm_storeu_si128((__m128i *)(pu1_dst + ((row + 6) * dst_strd)), src_temp7);
                _mm_storeu_si128((__m128i *)(pu1_dst + ((row + 7) * dst_strd)), src_temp8);

            }

        }
        else
        {
            __m128i src_temp9, src_temp10, src_temp11, src_temp12, src_temp13, src_temp14, src_temp15, src_temp16;
            for(row = 0; row < nt; row += 8)
            {
                /*pu1_ref[two_nt + col + idx + 1]*/
                src_temp1  = _mm_loadu_si128((__m128i *)(pu1_ref + two_nt - 0 + 0));
                src_temp9  = _mm_loadu_si128((__m128i *)(pu1_ref + two_nt - 0 + 16));
                src_temp2  = _mm_loadu_si128((__m128i *)(pu1_ref + two_nt - 1 + 0));
                src_temp10 = _mm_loadu_si128((__m128i *)(pu1_ref + two_nt - 1 + 16));
                src_temp3  = _mm_loadu_si128((__m128i *)(pu1_ref + two_nt - 2 + 0));
                src_temp11 = _mm_loadu_si128((__m128i *)(pu1_ref + two_nt - 2 + 16));
                src_temp4  = _mm_loadu_si128((__m128i *)(pu1_ref + two_nt - 3 + 0));
                src_temp12 = _mm_loadu_si128((__m128i *)(pu1_ref + two_nt - 3 + 16));

                _mm_storeu_si128((__m128i *)(pu1_dst +  0 + (0 * dst_strd)), src_temp1);
                _mm_storeu_si128((__m128i *)(pu1_dst + 16 + (0 * dst_strd)), src_temp9);
                _mm_storeu_si128((__m128i *)(pu1_dst +  0 + (1 * dst_strd)), src_temp2);
                _mm_storeu_si128((__m128i *)(pu1_dst + 16 + (1 * dst_strd)), src_temp10);
                _mm_storeu_si128((__m128i *)(pu1_dst +  0 + (2 * dst_strd)), src_temp3);
                _mm_storeu_si128((__m128i *)(pu1_dst + 16 + (2 * dst_strd)), src_temp11);
                _mm_storeu_si128((__m128i *)(pu1_dst +  0 + (3 * dst_strd)), src_temp4);
                _mm_storeu_si128((__m128i *)(pu1_dst + 16 + (3 * dst_strd)), src_temp12);

                src_temp5  = _mm_loadu_si128((__m128i *)(pu1_ref + two_nt - 4 + 0));
                src_temp13 = _mm_loadu_si128((__m128i *)(pu1_ref + two_nt - 4 + 16));
                src_temp6  = _mm_loadu_si128((__m128i *)(pu1_ref + two_nt - 5 + 0));
                src_temp14 = _mm_loadu_si128((__m128i *)(pu1_ref + two_nt - 5 + 16));
                src_temp7  = _mm_loadu_si128((__m128i *)(pu1_ref + two_nt - 6 + 0));
                src_temp15 = _mm_loadu_si128((__m128i *)(pu1_ref + two_nt - 6 + 16));
                src_temp8  = _mm_loadu_si128((__m128i *)(pu1_ref + two_nt - 7 + 0));
                src_temp16 = _mm_loadu_si128((__m128i *)(pu1_ref + two_nt - 7 + 16));

                _mm_storeu_si128((__m128i *)(pu1_dst +  0 + (4 * dst_strd)), src_temp5);
                _mm_storeu_si128((__m128i *)(pu1_dst + 16 + (4 * dst_strd)), src_temp13);
                _mm_storeu_si128((__m128i *)(pu1_dst +  0 + (5 * dst_strd)), src_temp6);
                _mm_storeu_si128((__m128i *)(pu1_dst + 16 + (5 * dst_strd)), src_temp14);
                _mm_storeu_si128((__m128i *)(pu1_dst +  0 + (6 * dst_strd)), src_temp7);
                _mm_storeu_si128((__m128i *)(pu1_dst + 16 + (6 * dst_strd)), src_temp15);
                _mm_storeu_si128((__m128i *)(pu1_dst +  0 + (7 * dst_strd)), src_temp8);
                _mm_storeu_si128((__m128i *)(pu1_dst + 16 + (7 * dst_strd)), src_temp16);

                pu1_ref -= 8;
                pu1_dst += 8 * dst_strd;
            }
        }
    }
}